

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManMerge(If_DsdMan_t *p,If_DsdMan_t *pNew)

{
  uint *puVar1;
  int iVar2;
  Vec_Mem_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  int iVar10;
  int iVar11;
  word Fill;
  ulong uVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  word *pTruth;
  int pFanins [12];
  int local_68 [14];
  
  if (p->nVars < pNew->nVars) {
    pcVar17 = "The number of variables should be the same or smaller.";
  }
  else {
    if (p->LutSize == pNew->LutSize) {
      if (p->nTtBits != pNew->nTtBits) {
        __assert_fail("p->nTtBits == pNew->nTtBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4c1,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      if (p->nConfigWords != pNew->nConfigWords) {
        __assert_fail("p->nConfigWords == pNew->nConfigWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4c2,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      iVar10 = (p->vObjs).nSize;
      lVar8 = (long)iVar10;
      iVar11 = 0;
      iVar13 = 0;
      if (0 < lVar8) {
        lVar14 = 0;
        do {
          if ((*(byte *)((long)(p->vObjs).pArray[lVar14] + 5) & 1) != 0) {
            iVar13 = 1;
            goto LAB_00422ae0;
          }
          lVar14 = lVar14 + 1;
        } while (lVar8 != lVar14);
        iVar13 = 0;
      }
LAB_00422ae0:
      iVar2 = (pNew->vObjs).nSize;
      lVar14 = (long)iVar2;
      if (0 < lVar14) {
        lVar18 = 0;
        do {
          if ((*(byte *)((long)(pNew->vObjs).pArray[lVar18] + 5) & 1) != 0) {
            iVar11 = 1;
            goto LAB_00422b0b;
          }
          lVar18 = lVar18 + 1;
        } while (lVar14 != lVar18);
        iVar11 = 0;
      }
LAB_00422b0b:
      if (iVar13 != iVar11) {
        pcVar17 = "no ";
        pcVar15 = "no ";
        if (0 < iVar10) {
          lVar18 = 0;
          pcVar15 = "";
          do {
            if ((*(byte *)((long)(p->vObjs).pArray[lVar18] + 5) & 1) != 0) goto LAB_00422b41;
            lVar18 = lVar18 + 1;
          } while (lVar8 != lVar18);
          pcVar15 = "no ";
        }
LAB_00422b41:
        if (0 < iVar2) {
          lVar8 = 0;
          do {
            if ((*(byte *)((long)(pNew->vObjs).pArray[lVar8] + 5) & 1) != 0) {
              pcVar17 = "";
              break;
            }
            lVar8 = lVar8 + 1;
          } while (lVar14 != lVar8);
        }
        printf("Warning! Old manager has %smarks while new manager has %smarks.\n",pcVar15,pcVar17);
      }
      iVar10 = (pNew->vObjs).nSize;
      p_00 = (Vec_Int_t *)malloc(0x10);
      iVar11 = 0x10;
      if (0xe < iVar10 - 1U) {
        iVar11 = iVar10;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar11;
      if (iVar11 == 0) {
        piVar9 = (int *)0x0;
      }
      else {
        piVar9 = (int *)malloc((long)iVar11 << 2);
      }
      p_00->pArray = piVar9;
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,1);
      if ((p->vConfigs != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
        Vec_WrdFillExtra(p->vConfigs,((pNew->vObjs).nSize + (p->vObjs).nSize) * p->nConfigWords,Fill
                        );
      }
      iVar10 = (pNew->vObjs).nSize;
      if (2 < iVar10) {
        lVar8 = 2;
        do {
          piVar9 = (int *)(pNew->vObjs).pArray[lVar8];
          uVar7 = piVar9[1];
          uVar6 = uVar7 >> 0x1b;
          if (0x7ffffff < uVar7) {
            uVar12 = 0;
            do {
              uVar16 = piVar9[uVar12 + 2];
              if (uVar16 == 0) break;
              if ((int)uVar16 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x134,"int Abc_Lit2LitV(int *, int)");
              }
              if (p_00->pArray[uVar16 >> 1] < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_68[uVar12] = (uVar16 & 1) + p_00->pArray[uVar16 >> 1] * 2;
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
          if ((uVar7 & 7) == 6) {
            pVVar3 = pNew->vTtMem[uVar6];
            uVar16 = 0xffffffff;
            if (0x17ffffff < uVar7) {
              iVar10 = *piVar9;
              if (((long)iVar10 < 0) || ((pNew->vTruths).nSize <= iVar10)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar16 = (pNew->vTruths).pArray[iVar10];
            }
            if (((int)uVar16 < 0) || (pVVar3->nEntries <= (int)uVar16)) {
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            pTruth = pVVar3->ppPages[uVar16 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                     (long)(int)(uVar16 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
          }
          else {
            pTruth = (word *)0x0;
          }
          uVar7 = If_DsdObjFindOrAdd(p,uVar7 & 7,local_68,uVar6,pTruth);
          if ((*(byte *)((long)piVar9 + 5) & 1) != 0) {
            if (((int)uVar7 < 0) || ((p->vObjs).nSize <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar1 = (uint *)((long)(p->vObjs).pArray[uVar7] + 4);
            *puVar1 = *puVar1 | 0x100;
          }
          pVVar4 = p->vConfigs;
          if ((pVVar4 != (Vec_Wrd_t *)0x0) && (pVVar5 = pNew->vConfigs, pVVar5 != (Vec_Wrd_t *)0x0))
          {
            iVar10 = p->nConfigWords;
            uVar6 = (int)lVar8 * iVar10;
            if ((int)uVar6 < pVVar5->nSize) {
              if ((((int)uVar6 < 0) || (uVar16 = iVar10 * uVar7, (int)uVar16 < 0)) ||
                 (pVVar4->nSize <= (int)uVar16)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              memcpy(pVVar4->pArray + uVar16,pVVar5->pArray + uVar6,(long)iVar10 << 3);
            }
          }
          Vec_IntPush(p_00,uVar7);
          lVar8 = lVar8 + 1;
          iVar10 = (pNew->vObjs).nSize;
        } while (lVar8 < iVar10);
      }
      if (p_00->nSize != iVar10) {
        __assert_fail("Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4db,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      pVVar4 = p->vConfigs;
      if ((pVVar4 != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
        iVar10 = (p->vObjs).nSize * p->nConfigWords;
        if (pVVar4->nSize < iVar10) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
        }
        pVVar4->nSize = iVar10;
      }
      return;
    }
    pcVar17 = "LUT size should be the same.";
  }
  puts(pcVar17);
  return;
}

Assistant:

void If_DsdManMerge( If_DsdMan_t * p, If_DsdMan_t * pNew )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int pFanins[DAU_MAX_VAR];
    int i, k, iFanin, Id;
    if ( p->nVars < pNew->nVars )
    {
        printf( "The number of variables should be the same or smaller.\n" );
        return;
    }
    if ( p->LutSize != pNew->LutSize )
    {
        printf( "LUT size should be the same.\n" );
        return;
    }
    assert( p->nTtBits == pNew->nTtBits );
    assert( p->nConfigWords == pNew->nConfigWords );
    if ( If_DsdManHasMarks(p) != If_DsdManHasMarks(pNew) )
        printf( "Warning! Old manager has %smarks while new manager has %smarks.\n", 
            If_DsdManHasMarks(p) ? "" : "no ", If_DsdManHasMarks(pNew) ? "" : "no " );
    vMap = Vec_IntAlloc( Vec_PtrSize(&pNew->vObjs) );
    Vec_IntPush( vMap, 0 );
    Vec_IntPush( vMap, 1 );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * (Vec_PtrSize(&p->vObjs) + Vec_PtrSize(&pNew->vObjs)), 0 );
    If_DsdVecForEachNode( &pNew->vObjs, pObj, i )
    {
        If_DsdObjForEachFaninLit( &pNew->vObjs, pObj, iFanin, k )
            pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
        Id = If_DsdObjFindOrAdd( p, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(pNew, pObj) : NULL );
        if ( pObj->fMark )
            If_DsdVecObjSetMark( &p->vObjs, Id );
        if ( p->vConfigs && pNew->vConfigs && p->nConfigWords * i < Vec_WrdSize(pNew->vConfigs) )
        {
            //Vec_WrdFillExtra( p->vConfigs, Id, Vec_WrdEntry(pNew->vConfigs, i) );
            word * pConfigNew = Vec_WrdEntryP(pNew->vConfigs, p->nConfigWords * i);
            word * pConfigOld = Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Id);
            memcpy( pConfigOld, pConfigNew, sizeof(word) * p->nConfigWords );
        }
        Vec_IntPush( vMap, Id );
    }
    assert( Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs) );
    Vec_IntFree( vMap );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdShrink( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs) );
}